

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

DdNode * Llb_NonlinImageCompute(DdNode *bCurrent,int fReorder,int fDrop,int fVerbose,int *pOrder)

{
  Llb_Prt_t *pPart;
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  abctime aVar6;
  DdNode *n;
  DdNode *n_00;
  Llb_Mgr_t *pLVar7;
  long lVar8;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  aVar4 = Abc_Clock();
  pLVar7 = p;
  iVar1 = p->iPartFree;
  p->iPartFree = iVar1 + 1;
  Llb_NonlinAddPartition(pLVar7,iVar1,bCurrent);
  for (lVar8 = 0; lVar8 < p->iPartFree; lVar8 = lVar8 + 1) {
    pPart = p->pParts[lVar8];
    if ((pPart != (Llb_Prt_t *)0x0) && (iVar1 = Llb_NonlinHasSingletonVars(p,pPart), iVar1 != 0)) {
      Llb_NonlinQuantify1(p,pPart,0);
    }
  }
  if (fReorder != 0) {
    Llb_NonlinReorder(p->dd,0,0);
  }
  pLVar7 = p;
  memcpy(pOrder,p->dd->invperm,(long)p->dd->size << 2);
  iVar1 = 0;
  do {
    Llb_NonlinRecomputeScores(pLVar7);
    do {
      iVar2 = Llb_NonlinNextPartitions(p,&local_38,&local_40);
      if (iVar2 == 0) {
        n = Cudd_ReadOne(p->dd);
        Cudd_Ref(n);
        lVar8 = 0;
        pLVar7 = p;
        do {
          if (pLVar7->iPartFree <= lVar8) {
            nSuppMax = pLVar7->nSuppMax;
            aVar5 = Abc_Clock();
            timeOther = timeOther + (aVar5 - (aVar4 + iVar1));
            Cudd_Deref(n);
            return n;
          }
          n_00 = n;
          if (pLVar7->pParts[lVar8] != (Llb_Prt_t *)0x0) {
            n_00 = Cudd_bddAnd(pLVar7->dd,n,pLVar7->pParts[lVar8]->bFunc);
            if (n_00 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(p->dd,n);
LAB_00668e0b:
              Llb_NonlinFree(p);
              return (DdNode *)0x0;
            }
            Cudd_Ref(n_00);
            Cudd_RecursiveDeref(p->dd,n);
            pLVar7 = p;
          }
          lVar8 = lVar8 + 1;
          n = n_00;
        } while( true );
      }
      aVar5 = Abc_Clock();
      iVar2 = Cudd_ReadReorderings(p->dd);
      iVar3 = Llb_NonlinQuantify2(p,local_38,local_40);
      if (iVar3 == 0) goto LAB_00668e0b;
      aVar6 = Abc_Clock();
      timeAndEx = timeAndEx + (aVar6 - aVar5);
      aVar6 = Abc_Clock();
      iVar1 = iVar1 + ((int)aVar6 - (int)aVar5);
      iVar3 = Cudd_ReadReorderings(p->dd);
      pLVar7 = p;
    } while (iVar3 <= iVar2);
  } while( true );
}

Assistant:

DdNode * Llb_NonlinImageCompute( DdNode * bCurrent, int fReorder, int fDrop, int fVerbose, int * pOrder )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    DdNode * bFunc, * bTemp;
    int i, nReorders, timeInside = 0;
    abctime clk = Abc_Clock(), clk2;

    // add partition
    Llb_NonlinAddPartition( p, p->iPartFree++, bCurrent );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_NonlinHasSingletonVars(p, pPart) )
            Llb_NonlinQuantify1( p, pPart, 0 );
    // reorder
    if ( fReorder )
        Llb_NonlinReorder( p->dd, 0, 0 );
    // save permutation
    memcpy( pOrder, p->dd->invperm, sizeof(int) * p->dd->size );

    // compute scores
    Llb_NonlinRecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_NonlinNextPartitions(p, &pPart1, &pPart2) )
    {
        clk2 = Abc_Clock();
        nReorders = Cudd_ReadReorderings(p->dd);
        if ( !Llb_NonlinQuantify2( p, pPart1, pPart2 ) )
        {
            Llb_NonlinFree( p );
            return NULL;
        }
        timeAndEx  += Abc_Clock() - clk2;
        timeInside += Abc_Clock() - clk2;
        if ( nReorders < Cudd_ReadReorderings(p->dd) )
            Llb_NonlinRecomputeScores( p );
//        else
//            Llb_NonlinVerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );
        if ( bFunc == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Llb_NonlinFree( p );
            return NULL;
        }
        Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    nSuppMax = p->nSuppMax;
    // reorder variables
//    if ( fReorder )
//        Llb_NonlinReorder( p->dd, 0, fVerbose );
    // save permutation
//    memcpy( pOrder, p->dd->invperm, sizeof(int) * Cudd_ReadSize(p->dd) );

    timeOther += Abc_Clock() - clk - timeInside;
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}